

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O2

int __thiscall jrtplib::RTPSession::SetLocalName(RTPSession *this,void *s,size_t len)

{
  int iVar1;
  
  if (this->created == true) {
    iVar1 = RTCPPacketBuilder::SetLocalName(&this->rtcpbuilder,s,len);
    return iVar1;
  }
  return -0x3e;
}

Assistant:

int RTPSession::SetLocalName(const void *s,size_t len)
{
	if (!created)
		return ERR_RTP_SESSION_NOTCREATED;

	int status;
	BUILDER_LOCK
	status = rtcpbuilder.SetLocalName(s,len);
	BUILDER_UNLOCK
	return status;
}